

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

Vec_Int_t * Lms_GiaCollectUsefulCos(Lms_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *pVVar5;
  Vec_Int_t *__ptr;
  int *piVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  
  iVar7 = p->vTtMem->nEntries;
  lVar10 = (long)iVar7;
  p_00 = (Vec_Int_t *)malloc(0x10);
  if (iVar7 - 1U < 0xf) {
    iVar7 = 0x10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar7 << 2);
  }
  p_00->pArray = piVar4;
  lVar10 = p->pGia->vCos->nSize + lVar10;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar7 = (int)lVar10;
  iVar12 = 0x10;
  if (0xe < iVar7 - 1U) {
    iVar12 = iVar7;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar12;
  iVar8 = 0;
  if (iVar12 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar12 << 2);
  }
  pVVar5->pArray = piVar4;
  pVVar5->nSize = iVar7;
  memset(piVar4,0xff,lVar10 * 4);
  __ptr = Lms_GiaCountTruths(p);
  iVar12 = __ptr->nSize;
  lVar10 = (long)iVar12;
  if (0 < lVar10) {
    piVar6 = __ptr->pArray;
    lVar11 = 0;
    iVar8 = 0;
    do {
      iVar1 = piVar6[lVar11];
      if (iVar1 < 1) {
        __assert_fail("Entry > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                      ,0x4ba,"Vec_Int_t *Lms_GiaCollectUsefulCos(Lms_Man_t *)");
      }
      Vec_IntPush(p_00,iVar8);
      iVar8 = iVar8 + iVar1 + 1;
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  Vec_IntPush(p_00,iVar8);
  if (__ptr->nCap < iVar12) {
    if (__ptr->pArray == (int *)0x0) {
      piVar6 = (int *)malloc(lVar10 * 4);
    }
    else {
      piVar6 = (int *)realloc(__ptr->pArray,lVar10 * 4);
    }
    __ptr->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    __ptr->nCap = iVar12;
  }
  if (0 < iVar12) {
    memset(__ptr->pArray,0,lVar10 << 2);
  }
  pVVar2 = p->vTruthIds;
  if (0 < pVVar2->nSize) {
    piVar6 = pVVar2->pArray;
    lVar10 = 0;
    do {
      iVar8 = piVar6[lVar10];
      lVar11 = (long)iVar8;
      if (-1 < lVar11) {
        if ((p_00->nSize <= iVar8) || (iVar12 <= iVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar3 = __ptr->pArray;
        uVar9 = piVar3[lVar11] + p_00->pArray[lVar11];
        if (((int)uVar9 < 0) || (iVar7 <= (int)uVar9)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if (piVar4[uVar9] != -1) {
          __assert_fail("*pPlace == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRec3.c"
                        ,0x4c7,"Vec_Int_t *Lms_GiaCollectUsefulCos(Lms_Man_t *)");
        }
        piVar4[uVar9] = (int)lVar10;
        piVar3 = piVar3 + lVar11;
        *piVar3 = *piVar3 + 1;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar2->nSize);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  return pVVar5;
}

Assistant:

Vec_Int_t * Lms_GiaCollectUsefulCos( Lms_Man_t * p )
{
    Vec_Int_t * vBegins = Vec_IntAlloc( Vec_MemEntryNum(p->vTtMem) );
    Vec_Int_t * vUseful = Vec_IntStartFull( Gia_ManCoNum(p->pGia) + Vec_MemEntryNum(p->vTtMem) );
    Vec_Int_t * vCounts = Lms_GiaCountTruths( p );
    int i, Entry, * pPlace, SumTotal = 0;
    // mark up the place for POs
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        assert( Entry > 0 );
        Vec_IntPush( vBegins, SumTotal );
        SumTotal += Entry + 1;
//        printf( "%d ", Entry );
    }
    Vec_IntPush( vBegins, SumTotal );
    // fill out POs in their places
    Vec_IntFill( vCounts, Vec_IntSize(vCounts), 0 );
    Vec_IntForEachEntry( p->vTruthIds, Entry, i )
    {
        if ( Entry < 0 )
            continue;
        pPlace = Vec_IntEntryP( vUseful, Vec_IntEntry(vBegins, Entry) + Vec_IntEntry(vCounts, Entry) );
        assert( *pPlace == -1 );
        *pPlace = i;
        Vec_IntAddToEntry( vCounts, Entry, 1 );
    }
    Vec_IntFree( vBegins );
    Vec_IntFree( vCounts );
    return vUseful;
}